

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spi.cpp
# Opt level: O3

BYTE __thiscall Spi::recv_byte(Spi *this)

{
  int iVar1;
  int *piVar2;
  BYTE byInputBuffer [1];
  DWORD dwNumBytesRead;
  BYTE local_35;
  int local_34;
  timespec local_30;
  
  local_34 = 0;
  iVar1 = FT_Read(this->ftHandle,&local_35,1);
  if (iVar1 == 0) {
    do {
      if (local_34 == 1) {
        return local_35;
      }
      local_30.tv_sec = 0;
      local_30.tv_nsec = 100000;
      do {
        iVar1 = nanosleep(&local_30,&local_30);
        if (iVar1 != -1) break;
        piVar2 = __errno_location();
      } while (*piVar2 == 4);
      iVar1 = FT_Read(this->ftHandle,&local_35,1,&local_34);
    } while (iVar1 == 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Read error.",0xb);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x38);
  std::ostream::put(-0x38);
  std::ostream::flush();
  error(this,2);
}

Assistant:

BYTE Spi::recv_byte() {
	FT_STATUS ftStatus;
	BYTE byInputBuffer[1];
	DWORD dwNumBytesRead = 0;
	while (1) {
		ftStatus = FT_Read(ftHandle, &byInputBuffer, 1, &dwNumBytesRead);
		if (ftStatus != FT_OK) {
			cerr << "Read error." << endl;
			error(2);
		}
		if (dwNumBytesRead == 1)
			break;
		std::this_thread::sleep_for(std::chrono::microseconds(100));
	}
	return byInputBuffer[0];
}